

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereAddIndexedExpr(Parse *pParse,Index *pIdx,int iIdxCur,SrcItem *pTabItem)

{
  ushort uVar1;
  Table *pTVar2;
  ExprList *pEVar3;
  long lVar4;
  ExprList_item *pEVar5;
  IndexedExpr *pIVar6;
  Expr *pEVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  void *pArg;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pIdx->nColumn != 0) {
    pTVar2 = pIdx->pTable;
    lVar9 = 8;
    uVar10 = 0;
    do {
      lVar4 = (long)pIdx->aiColumn[uVar10];
      if (lVar4 == -2) {
        pEVar5 = (ExprList_item *)((long)pIdx->aColExpr->a + lVar9 + -8);
LAB_00193c50:
        pEVar7 = pEVar5->pExpr;
LAB_00193c92:
        local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.walkerDepth = -0x55555556;
        local_68.eCode = 1;
        local_68.mWFlags = 0xaaaa;
        local_68.pParse = (Parse *)0x0;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        if (pEVar7 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar7);
          if (local_68.eCode == 0) {
            if (pParse->db == (sqlite3 *)0x0) {
              pIVar6 = (IndexedExpr *)sqlite3Malloc(0x20);
            }
            else {
              pIVar6 = (IndexedExpr *)sqlite3DbMallocRawNN(pParse->db,0x20);
            }
            if (pIVar6 == (IndexedExpr *)0x0) break;
            pIVar6->pIENext = pParse->pIdxEpr;
            pEVar7 = exprDup(pParse->db,pEVar7,0,(EdupBuf *)0x0);
            pIVar6->pExpr = pEVar7;
            pIVar6->iDataCur = pTabItem->iCursor;
            pIVar6->iIdxCur = iIdxCur;
            pIVar6->iIdxCol = (int)uVar10;
            pIVar6->bMaybeNullRow = ((pTabItem->fg).jointype & 0x58) != 0;
            pcVar8 = pIdx->zColAff;
            if (pcVar8 == (char *)0x0) {
              pcVar8 = computeIndexAffStr(pParse->db,pIdx);
              if (pcVar8 != (char *)0x0) {
                pcVar8 = pIdx->zColAff;
                goto LAB_00193d86;
              }
            }
            else {
LAB_00193d86:
              pIVar6->aff = pcVar8[uVar10];
            }
            pParse->pIdxEpr = pIVar6;
            if (pIVar6->pIENext == (IndexedExpr *)0x0) {
              sqlite3ParserAddCleanup(pParse,whereIndexedExprCleanup,&pParse->pIdxEpr);
            }
          }
        }
      }
      else if (-1 < pIdx->aiColumn[uVar10]) {
        if ((pTVar2->aCol[lVar4].colFlags & 0x20) != 0) {
          uVar1 = pTVar2->aCol[lVar4].iDflt;
          if ((((uVar1 != 0) && (pTVar2->eTabType == '\0')) &&
              (pEVar3 = (pTVar2->u).tab.pDfltList, pEVar3 != (ExprList *)0x0)) &&
             ((int)(uint)uVar1 <= pEVar3->nExpr)) {
            pEVar5 = pEVar3->a + (uVar1 - 1);
            goto LAB_00193c50;
          }
          pEVar7 = (Expr *)0x0;
          goto LAB_00193c92;
        }
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar10 < pIdx->nColumn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereAddIndexedExpr(
  Parse *pParse,     /* Add IndexedExpr entries to pParse->pIdxEpr */
  Index *pIdx,       /* The index-on-expression that contains the expressions */
  int iIdxCur,       /* Cursor number for pIdx */
  SrcItem *pTabItem  /* The FROM clause entry for the table */
){
  int i;
  IndexedExpr *p;
  Table *pTab;
  assert( pIdx->bHasExpr );
  pTab = pIdx->pTable;
  for(i=0; i<pIdx->nColumn; i++){
    Expr *pExpr;
    int j = pIdx->aiColumn[i];
    if( j==XN_EXPR ){
      pExpr = pIdx->aColExpr->a[i].pExpr;
    }else if( j>=0 && (pTab->aCol[j].colFlags & COLFLAG_VIRTUAL)!=0 ){
      pExpr = sqlite3ColumnExpr(pTab, &pTab->aCol[j]);
    }else{
      continue;
    }
    if( sqlite3ExprIsConstant(0,pExpr) ) continue;
    p = sqlite3DbMallocRaw(pParse->db,  sizeof(IndexedExpr));
    if( p==0 ) break;
    p->pIENext = pParse->pIdxEpr;
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace & 0x200 ){
      sqlite3DebugPrintf("New pParse->pIdxEpr term {%d,%d}\n", iIdxCur, i);
      if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(pExpr);
    }
#endif
    p->pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
    p->iDataCur = pTabItem->iCursor;
    p->iIdxCur = iIdxCur;
    p->iIdxCol = i;
    p->bMaybeNullRow = (pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0;
    if( sqlite3IndexAffinityStr(pParse->db, pIdx) ){
      p->aff = pIdx->zColAff[i];
    }
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    p->zIdxName = pIdx->zName;
#endif
    pParse->pIdxEpr = p;
    if( p->pIENext==0 ){
      void *pArg = (void*)&pParse->pIdxEpr;
      sqlite3ParserAddCleanup(pParse, whereIndexedExprCleanup, pArg);
    }
  }
}